

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O3

void * ares_htable_strvp_get_direct(ares_htable_strvp_t *htable,char *key)

{
  void *pvVar1;
  
  if (key == (char *)0x0 || htable == (ares_htable_strvp_t *)0x0) {
    return (void *)0x0;
  }
  pvVar1 = ares_htable_get(htable->hash,key);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = *(void **)((long)pvVar1 + 8);
  }
  return pvVar1;
}

Assistant:

ares_bool_t ares_htable_strvp_get(const ares_htable_strvp_t *htable,
                                  const char *key, void **val)
{
  ares_htable_strvp_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL || key == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}